

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

void __thiscall
ProString::ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          *str)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
  ::convertTo<QString>((QString *)&local_30,str);
  ProString(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}